

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O3

WebPUpsampleLinePairFunc WebPGetLinePairConverter(int alpha_is_last)

{
  WebPInitUpsamplers();
  return WebPUpsamplers[(ulong)(alpha_is_last == 0) + 3];
}

Assistant:

WebPUpsampleLinePairFunc WebPGetLinePairConverter(int alpha_is_last) {
  WebPInitUpsamplers();
#ifdef FANCY_UPSAMPLING
  return WebPUpsamplers[alpha_is_last ? MODE_BGRA : MODE_ARGB];
#else
  return (alpha_is_last ? DualLineSamplerBGRA : DualLineSamplerARGB);
#endif
}